

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::
emplaceRealloc<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
          (SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter> *this,
          pointer pos,TypeSetter *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  pointer p;
  Expression *pEVar4;
  undefined8 uVar5;
  pointer pTVar6;
  pointer pTVar7;
  pointer pTVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar11 = this->len + 1;
  uVar3 = this->cap;
  if (uVar11 < uVar3 * 2) {
    uVar11 = uVar3 * 2;
  }
  if (0x7ffffffffffffff - uVar3 < uVar3) {
    uVar11 = 0x7ffffffffffffff;
  }
  lVar12 = (long)pos - (long)this->data_;
  pTVar8 = (pointer)operator_new(uVar11 << 4);
  pEVar4 = (args->expr).ptr;
  *(undefined8 *)((long)pTVar8 + lVar12) = (args->type).ptr;
  ((undefined8 *)((long)pTVar8 + lVar12))[1] = pEVar4;
  p = this->data_;
  lVar9 = this->len * 0x10;
  lVar10 = (long)p + (lVar9 - (long)pos);
  pTVar6 = p;
  pTVar7 = pTVar8;
  if (lVar10 == 0) {
    if (this->len != 0) {
      lVar10 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(p->type).ptr + lVar10);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pTVar8->type).ptr + lVar10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        lVar10 = lVar10 + 0x10;
      } while (lVar9 != lVar10);
    }
  }
  else {
    for (; pTVar6 != pos; pTVar6 = pTVar6 + 1) {
      pEVar4 = (pTVar6->expr).ptr;
      (pTVar7->type).ptr = (pTVar6->type).ptr;
      (pTVar7->expr).ptr = pEVar4;
      pTVar7 = pTVar7 + 1;
    }
    memcpy((void *)((long)pTVar8 + lVar12 + 0x10),pos,(lVar10 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar11;
  this->data_ = pTVar8;
  return (pointer)((long)pTVar8 + lVar12);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}